

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void * event_mm_calloc_(size_t count,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  void *pvVar4;
  int *piVar5;
  void *unaff_R14;
  
  if (size == 0 || count == 0) {
    return (void *)0x0;
  }
  if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
    pvVar4 = calloc(count,size);
    return pvVar4;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = count;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    pvVar4 = (*mm_malloc_fn_)(size * count);
    if (pvVar4 != (void *)0x0) {
      memset(pvVar4,0,size * count);
      bVar3 = true;
      unaff_R14 = pvVar4;
      goto LAB_001ec373;
    }
  }
  bVar3 = false;
LAB_001ec373:
  if (!bVar3) {
    piVar5 = __errno_location();
    *piVar5 = 0xc;
    return (void *)0x0;
  }
  return unaff_R14;
}

Assistant:

void *
event_mm_calloc_(size_t count, size_t size)
{
	if (count == 0 || size == 0)
		return NULL;

	if (mm_malloc_fn_) {
		size_t sz = count * size;
		void *p = NULL;
		if (count > EV_SIZE_MAX / size)
			goto error;
		p = mm_malloc_fn_(sz);
		if (p)
			return memset(p, 0, sz);
	} else {
		void *p = calloc(count, size);
#ifdef _WIN32
		/* Windows calloc doesn't reliably set ENOMEM */
		if (p == NULL)
			goto error;
#endif
		return p;
	}

error:
	errno = ENOMEM;
	return NULL;
}